

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  int iVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  ImDrawChannel *pIVar4;
  ImDrawCmd *pIVar5;
  int iVar6;
  int i;
  int i_00;
  ulong uVar7;
  long lVar8;
  unsigned_short *__dest;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  
  if (1 < this->_Count) {
    iVar6 = 0;
    SetCurrentChannel(this,draw_list,0);
    if ((draw_list->CmdBuffer).Size != 0) {
      pIVar3 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer);
      if (pIVar3->ElemCount == 0) {
        ImVector<ImDrawCmd>::pop_back(&draw_list->CmdBuffer);
      }
    }
    if (this->_Count < 1) {
      pIVar3 = (ImDrawCmd *)0x0;
    }
    else if ((draw_list->CmdBuffer).Size < 1) {
      pIVar3 = (ImDrawCmd *)0x0;
      iVar6 = 0;
    }
    else {
      pIVar3 = ImVector<ImDrawCmd>::back(&draw_list->CmdBuffer);
      iVar6 = pIVar3->ElemCount + pIVar3->IdxOffset;
    }
    iVar9 = 0;
    iVar10 = 0;
    for (i_00 = 1; i_00 < this->_Count; i_00 = i_00 + 1) {
      pIVar4 = ImVector<ImDrawChannel>::operator[](&this->_Channels,i_00);
      if (0 < (pIVar4->_CmdBuffer).Size) {
        pIVar5 = ImVector<ImDrawCmd>::back(&pIVar4->_CmdBuffer);
        if (pIVar5->ElemCount == 0) {
          ImVector<ImDrawCmd>::pop_back(&pIVar4->_CmdBuffer);
        }
      }
      uVar2 = (pIVar4->_CmdBuffer).Size;
      if (pIVar3 != (ImDrawCmd *)0x0 && 0 < (int)uVar2) {
        pIVar5 = ImVector<ImDrawCmd>::operator[](&pIVar4->_CmdBuffer,0);
        auVar11[0] = -(*(char *)&(pIVar3->ClipRect).x == *(char *)&(pIVar5->ClipRect).x);
        auVar11[1] = -(*(char *)((long)&(pIVar3->ClipRect).x + 1) ==
                      *(char *)((long)&(pIVar5->ClipRect).x + 1));
        auVar11[2] = -(*(char *)((long)&(pIVar3->ClipRect).x + 2) ==
                      *(char *)((long)&(pIVar5->ClipRect).x + 2));
        auVar11[3] = -(*(char *)((long)&(pIVar3->ClipRect).x + 3) ==
                      *(char *)((long)&(pIVar5->ClipRect).x + 3));
        auVar11[4] = -(*(char *)&(pIVar3->ClipRect).y == *(char *)&(pIVar5->ClipRect).y);
        auVar11[5] = -(*(char *)((long)&(pIVar3->ClipRect).y + 1) ==
                      *(char *)((long)&(pIVar5->ClipRect).y + 1));
        auVar11[6] = -(*(char *)((long)&(pIVar3->ClipRect).y + 2) ==
                      *(char *)((long)&(pIVar5->ClipRect).y + 2));
        auVar11[7] = -(*(char *)((long)&(pIVar3->ClipRect).y + 3) ==
                      *(char *)((long)&(pIVar5->ClipRect).y + 3));
        auVar11[8] = -(*(char *)&(pIVar3->ClipRect).z == *(char *)&(pIVar5->ClipRect).z);
        auVar11[9] = -(*(char *)((long)&(pIVar3->ClipRect).z + 1) ==
                      *(char *)((long)&(pIVar5->ClipRect).z + 1));
        auVar11[10] = -(*(char *)((long)&(pIVar3->ClipRect).z + 2) ==
                       *(char *)((long)&(pIVar5->ClipRect).z + 2));
        auVar11[0xb] = -(*(char *)((long)&(pIVar3->ClipRect).z + 3) ==
                        *(char *)((long)&(pIVar5->ClipRect).z + 3));
        auVar11[0xc] = -(*(char *)&(pIVar3->ClipRect).w == *(char *)&(pIVar5->ClipRect).w);
        auVar11[0xd] = -(*(char *)((long)&(pIVar3->ClipRect).w + 1) ==
                        *(char *)((long)&(pIVar5->ClipRect).w + 1));
        auVar11[0xe] = -(*(char *)((long)&(pIVar3->ClipRect).w + 2) ==
                        *(char *)((long)&(pIVar5->ClipRect).w + 2));
        auVar11[0xf] = -(*(char *)((long)&(pIVar3->ClipRect).w + 3) ==
                        *(char *)((long)&(pIVar5->ClipRect).w + 3));
        if (((((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar11[0xf] >> 7) << 0xf) == 0xffff) &&
             (pIVar3->TextureId == pIVar5->TextureId)) && (pIVar3->VtxOffset == pIVar5->VtxOffset))
           && (pIVar5->UserCallback == (ImDrawCallback)0x0 &&
               pIVar3->UserCallback == (ImDrawCallback)0x0)) {
          pIVar5 = ImVector<ImDrawCmd>::operator[](&pIVar4->_CmdBuffer,0);
          pIVar3->ElemCount = pIVar3->ElemCount + pIVar5->ElemCount;
          pIVar5 = ImVector<ImDrawCmd>::operator[](&pIVar4->_CmdBuffer,0);
          iVar6 = iVar6 + pIVar5->ElemCount;
          ImVector<ImDrawCmd>::erase(&pIVar4->_CmdBuffer,(pIVar4->_CmdBuffer).Data);
        }
        uVar2 = (pIVar4->_CmdBuffer).Size;
      }
      if (0 < (int)uVar2) {
        pIVar3 = ImVector<ImDrawCmd>::back(&pIVar4->_CmdBuffer);
        uVar2 = (pIVar4->_CmdBuffer).Size;
      }
      iVar1 = (pIVar4->_IdxBuffer).Size;
      pIVar5 = (pIVar4->_CmdBuffer).Data;
      uVar7 = 0;
      if (0 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      for (lVar8 = 0; uVar7 * 0x38 - lVar8 != 0; lVar8 = lVar8 + 0x38) {
        *(int *)((long)&pIVar5->IdxOffset + lVar8) = iVar6;
        iVar6 = iVar6 + *(int *)((long)&pIVar5->ElemCount + lVar8);
      }
      iVar10 = iVar10 + uVar2;
      iVar9 = iVar9 + iVar1;
    }
    ImVector<ImDrawCmd>::resize(&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + iVar10);
    ImVector<unsigned_short>::resize(&draw_list->IdxBuffer,(draw_list->IdxBuffer).Size + iVar9);
    pIVar3 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar10);
    __dest = (draw_list->IdxBuffer).Data + ((long)(draw_list->IdxBuffer).Size - (long)iVar9);
    for (iVar6 = 1; iVar6 < this->_Count; iVar6 = iVar6 + 1) {
      pIVar4 = ImVector<ImDrawChannel>::operator[](&this->_Channels,iVar6);
      lVar8 = (long)(pIVar4->_CmdBuffer).Size;
      if (lVar8 != 0) {
        memcpy(pIVar3,(pIVar4->_CmdBuffer).Data,lVar8 * 0x38);
        pIVar3 = pIVar3 + lVar8;
      }
      lVar8 = (long)(pIVar4->_IdxBuffer).Size;
      if (lVar8 != 0) {
        memcpy(__dest,(pIVar4->_IdxBuffer).Data,lVar8 * 2);
        __dest = __dest + lVar8;
      }
    }
    draw_list->_IdxWritePtr = __dest;
    ImDrawList::UpdateClipRect(draw_list);
    this->_Count = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    if (draw_list->CmdBuffer.Size != 0 && draw_list->CmdBuffer.back().ElemCount == 0)
        draw_list->CmdBuffer.pop_back();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();
        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL && CanMergeDrawCommands(last_cmd, &ch._CmdBuffer[0]))
        {
            // Merge previous channel last draw command with current channel first draw command if matching.
            last_cmd->ElemCount += ch._CmdBuffer[0].ElemCount;
            idx_offset += ch._CmdBuffer[0].ElemCount;
            ch._CmdBuffer.erase(ch._CmdBuffer.Data);
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;
    draw_list->UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    _Count = 1;
}